

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O0

void Amap_LibWriteGate(FILE *pFile,Amap_Gat_t *pGate,int fPrintDsd)

{
  Amap_Pin_t *local_28;
  Amap_Pin_t *pPin;
  int fPrintDsd_local;
  Amap_Gat_t *pGate_local;
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,"GATE ");
  fprintf((FILE *)pFile,"%12s ",pGate->pName);
  fprintf((FILE *)pFile,"%10.2f   ",pGate->dArea);
  fprintf((FILE *)pFile,"%s=%s;\n",pGate->pOutName,pGate->pForm);
  if (fPrintDsd != 0) {
    if (pGate->pFunc == (uint *)0x0) {
      printf("Truth table is not available.\n");
    }
    else {
      Kit_DsdPrintFromTruth(pGate->pFunc,*(uint *)&pGate->field_0x38 >> 0x18);
    }
  }
  for (local_28 = (Amap_Pin_t *)(pGate + 1);
      local_28 <
      (Amap_Pin_t *)((long)pGate + (long)(int)(*(uint *)&pGate->field_0x38 >> 0x18) * 0x48 + 0x40);
      local_28 = local_28 + 1) {
    Amap_LibWritePin(pFile,local_28);
  }
  return;
}

Assistant:

void Amap_LibWriteGate( FILE * pFile, Amap_Gat_t * pGate, int fPrintDsd )
{
    Amap_Pin_t * pPin;
    fprintf( pFile, "GATE " );
    fprintf( pFile, "%12s ",      pGate->pName );
    fprintf( pFile, "%10.2f   ",  pGate->dArea );
    fprintf( pFile, "%s=%s;\n",   pGate->pOutName,    pGate->pForm );
    if ( fPrintDsd )
    {
        if ( pGate->pFunc == NULL )
            printf( "Truth table is not available.\n" );
        else
            Kit_DsdPrintFromTruth( pGate->pFunc, pGate->nPins );
    }
    Amap_GateForEachPin( pGate, pPin )
        Amap_LibWritePin( pFile, pPin );
}